

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

void __thiscall xray_re::xr_ini_file::ini_section::merge(ini_section *this,ini_section *section)

{
  pointer ppiVar1;
  int iVar2;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  __position;
  ini_item *piVar3;
  ini_item *piVar4;
  pointer ppiVar5;
  ini_item_vec *this_00;
  ini_item *item;
  ini_item_vec *local_40;
  ini_item *local_38;
  
  this_00 = &this->items;
  if ((this->items).
      super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->items).
      super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
    ::reserve(this_00,(long)(section->items).
                            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(section->items).
                            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppiVar1 = (section->items).
              super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppiVar5 = (section->items).
                   super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppiVar5 != ppiVar1;
        ppiVar5 = ppiVar5 + 1) {
      piVar4 = (ini_item *)operator_new(0x40);
      ini_item::ini_item(piVar4,*ppiVar5);
      item = piVar4;
      std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>::
      emplace_back<xray_re::xr_ini_file::ini_item*>
                ((vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>
                  *)this_00,&item);
    }
  }
  else {
    ppiVar1 = (section->items).
              super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = this_00;
    for (ppiVar5 = (section->items).
                   super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppiVar5 != ppiVar1;
        ppiVar5 = ppiVar5 + 1) {
      item = *ppiVar5;
      __position = std::
                   __lower_bound<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item**,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_const*,__gnu_cxx::__ops::_Iter_comp_val<xray_re::ptr_less<xray_re::xr_ini_file::ini_item>>>
                             ((this->items).
                              super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (this->items).
                              super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&item);
      piVar4 = item;
      if (__position._M_current ==
          (this->items).
          super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00155d23:
        piVar3 = (ini_item *)operator_new(0x40);
        ini_item::ini_item(piVar3,piVar4);
        local_38 = piVar3;
        std::
        vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
        ::_M_insert_rval(local_40,(const_iterator)__position._M_current,&local_38);
      }
      else {
        piVar3 = *__position._M_current;
        iVar2 = strcasecmp((piVar3->name)._M_dataplus._M_p,(item->name)._M_dataplus._M_p);
        if (iVar2 != 0) goto LAB_00155d23;
        std::__cxx11::string::_M_assign((string *)&piVar3->value);
      }
    }
  }
  return;
}

Assistant:

void xr_ini_file::ini_section::merge(const ini_section* section)
{
	if (items.empty()) {
		items.reserve(section->size());
		for (ini_item_vec_cit it = section->begin(), last = section->end();
				it != last; ++it) {
			items.push_back(new ini_item(**it));
		}
	} else {
		// FIXME: do it O(max(M, N)) instead of O(M*log(N))
		for (ini_item_vec_cit it = section->begin(), last = section->end();
				it != last; ++it) {
			const ini_item* item = *it;
			ini_item_vec_it it1 = std::lower_bound(begin(), end(), item, ptr_less<ini_item>());
			if (it1 == end() || xr_stricmp((*it1)->name.c_str(), item->name.c_str()) != 0)
				items.insert(it1, new ini_item(*item));
			else
				(*it1)->value = item->value;
		}
	}
}